

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateDataDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,CommandData *commandData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          *templatedParams,CommandFlavourFlags flavourFlags,bool raii,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,string *dataType,string *returnType,string *returnVariable)

{
  long lVar1;
  
  lVar1 = (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if ((long)(dataTypes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(dataTypes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 != lVar1) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x1771,
                  "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                 );
  }
  switch(lVar1) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    break;
  case 1:
    generateDataDeclarations1Return
              (__return_storage_ptr__,this,commandData,returnParams,vectorParams,templatedParams,
               flavourFlags,dataTypes,dataType,returnType,returnVariable);
    break;
  case 2:
    if ((flavourFlags.m_mask & 8) != 0) {
      __assert_fail("!( flavourFlags & CommandFlavourFlagBits::unique )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x177a,
                    "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                   );
    }
    generateDataDeclarations2Returns
              (__return_storage_ptr__,this,commandData,returnParams,vectorParams,flavourFlags,raii,
               dataTypes,dataType,returnVariable);
    break;
  case 3:
    if ((flavourFlags.m_mask & 0xc) != 0) {
      __assert_fail("!( flavourFlags & ( CommandFlavourFlagBits::singular | CommandFlavourFlagBits::unique ) )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x177d,
                    "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                   );
    }
    generateDataDeclarations3Returns
              (__return_storage_ptr__,(VulkanHppGenerator *)(ulong)raii,commandData,returnParams,
               vectorParams,flavourFlags,raii,dataTypes);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x177f,
                  "std::string VulkanHppGenerator::generateDataDeclarations(const CommandData &, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, const std::set<size_t> &, CommandFlavourFlags, bool, const std::vector<std::string> &, const std::string &, const std::string &, const std::string &) const"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDataDeclarations( CommandData const &                       commandData,
                                                          std::vector<size_t> const &               returnParams,
                                                          std::map<size_t, VectorParamData> const & vectorParams,
                                                          std::set<size_t> const &                  templatedParams,
                                                          CommandFlavourFlags                       flavourFlags,
                                                          bool                                      raii,
                                                          std::vector<std::string> const &          dataTypes,
                                                          std::string const &                       dataType,
                                                          std::string const &                       returnType,
                                                          std::string const &                       returnVariable ) const
{
  assert( dataTypes.size() == returnParams.size() );

  switch ( returnParams.size() )
  {
    case 0: return "";  // no returnParams -> no data declarations
    case 1:
      return generateDataDeclarations1Return(
        commandData, returnParams, vectorParams, templatedParams, flavourFlags, dataTypes, dataType, returnType, returnVariable );
    case 2:
      assert( !( flavourFlags & CommandFlavourFlagBits::unique ) );
      return generateDataDeclarations2Returns( commandData, returnParams, vectorParams, flavourFlags, raii, dataTypes, dataType, returnVariable );
    case 3:
      assert( !( flavourFlags & ( CommandFlavourFlagBits::singular | CommandFlavourFlagBits::unique ) ) );
      return generateDataDeclarations3Returns( commandData, returnParams, vectorParams, flavourFlags, raii, dataTypes );
    default: assert( false ); return "";
  }
}